

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_control_impl.cc
# Opt level: O0

void __thiscall webrtc::GainControlImpl::ReadQueuedRenderData(GainControlImpl *this)

{
  ulong uVar1;
  bool bVar2;
  pointer this_00;
  ostream *poVar3;
  unsigned_long *puVar4;
  size_type sVar5;
  reference this_01;
  pointer this_02;
  Handle *state;
  reference in_far;
  unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
  *gain_controller;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
  *__range2;
  size_t num_frames_per_band;
  unsigned_long local_1d0;
  string *local_1c8;
  string *_result;
  FatalMessage local_1b8;
  FatalMessageVoidify local_39;
  size_type local_38;
  size_t buffer_index;
  undefined4 local_1c;
  CritScope local_18;
  CritScope cs;
  GainControlImpl *this_local;
  
  cs.cs_ = (CriticalSection *)this;
  rtc::CritScope::CritScope(&local_18,this->crit_capture_);
  if ((this->enabled_ & 1U) == 0) {
    local_1c = 1;
  }
  else {
    while( true ) {
      this_00 = std::
                unique_ptr<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>,_std::default_delete<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_>_>
                ::operator->(&this->render_signal_queue_);
      bVar2 = SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
              ::Remove(this_00,&this->capture_queue_buffer_);
      if (!bVar2) break;
      local_38 = 0;
      _result._7_1_ = 0;
      bVar2 = rtc::Optional::operator_cast_to_bool((Optional *)&this->num_proc_channels_);
      if (!bVar2) {
        rtc::FatalMessageVoidify::FatalMessageVoidify(&local_39);
        rtc::FatalMessage::FatalMessage
                  (&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/gain_control_impl.cc"
                   ,0x9f);
        _result._7_1_ = 1;
        poVar3 = rtc::FatalMessage::stream(&local_1b8);
        poVar3 = std::operator<<(poVar3,"Check failed: num_proc_channels_");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"# ");
        rtc::FatalMessageVoidify::operator&(&local_39,poVar3);
      }
      if ((_result._7_1_ & 1) != 0) {
        rtc::FatalMessage::~FatalMessage(&local_1b8);
      }
      local_1d0 = 0;
      puVar4 = rtc::Optional<unsigned_long>::operator*(&this->num_proc_channels_);
      local_1c8 = rtc::CheckLTImpl<unsigned_long,unsigned_long>
                            (&local_1d0,puVar4,"0ul < *num_proc_channels_");
      if (local_1c8 != (string *)0x0) {
        rtc::FatalMessage::FatalMessage
                  ((FatalMessage *)&num_frames_per_band,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/gain_control_impl.cc"
                   ,0xa0,local_1c8);
        rtc::FatalMessage::stream((FatalMessage *)&num_frames_per_band);
        rtc::FatalMessage::~FatalMessage((FatalMessage *)&num_frames_per_band);
      }
      sVar5 = std::vector<short,_std::allocator<short>_>::size(&this->capture_queue_buffer_);
      puVar4 = rtc::Optional<unsigned_long>::operator*(&this->num_proc_channels_);
      uVar1 = *puVar4;
      __end2 = std::
               vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
               ::begin(&this->gain_controllers_);
      gain_controller =
           (unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
            *)std::
              vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
              ::end(&this->gain_controllers_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_*,_std::vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>_>
                                         *)&gain_controller), bVar2) {
        this_01 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_*,_std::vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>_>
                  ::operator*(&__end2);
        this_02 = std::
                  unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                  ::operator->(this_01);
        state = GainController::state(this_02);
        in_far = std::vector<short,_std::allocator<short>_>::operator[]
                           (&this->capture_queue_buffer_,local_38);
        WebRtcAgc_AddFarend(state,in_far,sVar5 / uVar1);
        local_38 = sVar5 / uVar1 + local_38;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_*,_std::vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    local_1c = 0;
  }
  rtc::CritScope::~CritScope(&local_18);
  return;
}

Assistant:

void GainControlImpl::ReadQueuedRenderData() {
  rtc::CritScope cs(crit_capture_);

  if (!enabled_) {
    return;
  }

  while (render_signal_queue_->Remove(&capture_queue_buffer_)) {
    size_t buffer_index = 0;
    RTC_DCHECK(num_proc_channels_);
    RTC_DCHECK_LT(0ul, *num_proc_channels_);
    const size_t num_frames_per_band =
        capture_queue_buffer_.size() / (*num_proc_channels_);
    for (auto& gain_controller : gain_controllers_) {
      WebRtcAgc_AddFarend(gain_controller->state(),
                          &capture_queue_buffer_[buffer_index],
                          num_frames_per_band);

      buffer_index += num_frames_per_band;
    }
  }
}